

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O3

int __thiscall IInput::CursorRelative(IInput *this,float *pX,float *pY)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  
  iVar2 = (*(this->super_IInterface)._vptr_IInterface[0xc])();
  iVar3 = 1;
  if ((char)iVar2 == '\0') {
    iVar2 = (*(this->super_IInterface)._vptr_IInterface[7])(this);
    plVar4 = (long *)CONCAT44(extraout_var,iVar2);
    if ((plVar4 != (long *)0x0) &&
       (cVar1 = (**(code **)(*plVar4 + 0x40))(plVar4,pX,pY), cVar1 != '\0')) {
      return 2;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int CursorRelative(float *pX, float *pY)
	{
		if(MouseRelative(pX, pY))
			return CURSOR_MOUSE;
		IJoystick *pJoystick = GetActiveJoystick();
		if(pJoystick && pJoystick->Relative(pX, pY))
			return CURSOR_JOYSTICK;
		return CURSOR_NONE;
	}